

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

ImageChannelDesc * __thiscall
pbrt::Image::AllChannelsDesc(ImageChannelDesc *__return_storage_ptr__,Image *this)

{
  uint uVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar3;
  ulong uVar4;
  
  ImageChannelDesc::ImageChannelDesc(__return_storage_ptr__);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize
            (&__return_storage_ptr__->offset,(long)(int)(this->channelNames).nStored);
  paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
            *)(__return_storage_ptr__->offset).ptr;
  uVar1 = (uint)(this->channelNames).nStored;
  paVar3 = &(__return_storage_ptr__->offset).field_2;
  if (paVar2 != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                 *)0x0) {
    paVar3 = paVar2;
  }
  for (uVar4 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar4; uVar4 = uVar4 + 1) {
    paVar3->fixed[uVar4] = (int)uVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelDesc AllChannelsDesc() const {
        ImageChannelDesc desc;
        desc.offset.resize(NChannels());
        for (int i = 0; i < NChannels(); ++i)
            desc.offset[i] = i;
        return desc;
    }